

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParseContent(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlChar *pxVar4;
  __int32_t *p_Var5;
  charactersSAXFunc p_Var6;
  xmlParserInputPtr pxVar7;
  __int32_t **pp_Var8;
  uint uVar9;
  int bogus;
  
  pxVar7 = ctxt->input;
  if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  do {
    pxVar7 = ctxt->input;
    pxVar4 = pxVar7->cur;
    if ((1 < ctxt->disableSAX) || (pxVar7->end <= pxVar4)) {
      if (pxVar7->end <= pxVar4) {
        htmlAutoCloseOnEnd(ctxt);
        return;
      }
      return;
    }
    if ((ctxt->endCheckState == 0) && (*pxVar4 == '<')) {
      bVar3 = pxVar4[1];
      if (bVar3 == 0x21) {
        pp_Var8 = __ctype_toupper_loc();
        p_Var5 = *pp_Var8;
        if (((((p_Var5[pxVar4[2]] != 0x44) || (p_Var5[pxVar4[3]] != 0x4f)) ||
             (p_Var5[pxVar4[4]] != 0x43)) ||
            ((p_Var5[pxVar4[5]] != 0x54 || (p_Var5[pxVar4[6]] != 0x59)))) ||
           ((p_Var5[pxVar4[7]] != 0x50 || (p_Var5[pxVar4[8]] != 0x45)))) {
          if ((pxVar4[2] != 0x2d) || (pxVar4[3] != '-')) {
            pxVar7->cur = pxVar4 + 2;
            pxVar7->col = pxVar7->col + 2;
            goto LAB_00161880;
          }
          pxVar7->cur = pxVar4 + 4;
          pxVar7->col = pxVar7->col + 4;
          bogus = 0;
          goto LAB_00161885;
        }
        htmlParseDocTypeDecl(ctxt);
      }
      else if (bVar3 == 0x3f) {
        pxVar7->cur = pxVar4 + 1;
        pxVar7->col = pxVar7->col + 1;
LAB_00161880:
        bogus = 1;
LAB_00161885:
        htmlParseComment(ctxt,bogus);
      }
      else if (bVar3 == 0x2f) {
        htmlParseEndTag(ctxt);
      }
      else if ((byte)((bVar3 | 0x20) + 0x9f) < 0x1a) {
        htmlParseElementInternal(ctxt);
      }
      else {
        htmlStartCharData(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var6 = ctxt->sax->characters, p_Var6 != (charactersSAXFunc)0x0)) {
          (*p_Var6)(ctxt->userData,"<",1);
        }
        pxVar7 = ctxt->input;
        ppxVar1 = &pxVar7->cur;
        *ppxVar1 = *ppxVar1 + 1;
        piVar2 = &pxVar7->col;
        *piVar2 = *piVar2 + 1;
      }
    }
    else {
      htmlParseCharData(ctxt,0);
    }
    pxVar7 = ctxt->input;
    uVar9 = pxVar7->flags;
    if ((((uVar9 & 0x40) == 0) && (500 < (long)pxVar7->cur - (long)pxVar7->base)) &&
       ((long)pxVar7->end - (long)pxVar7->cur < 500)) {
      xmlParserShrink(ctxt);
      pxVar7 = ctxt->input;
      uVar9 = pxVar7->flags;
    }
    if (((uVar9 & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  } while( true );
}

Assistant:

static void
htmlParseContent(htmlParserCtxtPtr ctxt) {
    GROW;

    while ((PARSER_STOPPED(ctxt) == 0) &&
           (ctxt->input->cur < ctxt->input->end)) {
        int mode;

        mode = ctxt->endCheckState;

        if ((mode == 0) && (CUR == '<')) {
            if (NXT(1) == '/') {
	        htmlParseEndTag(ctxt);
            } else if (NXT(1) == '!') {
                /*
                 * Sometimes DOCTYPE arrives in the middle of the document
                 */
                if ((UPP(2) == 'D') && (UPP(3) == 'O') &&
                    (UPP(4) == 'C') && (UPP(5) == 'T') &&
                    (UPP(6) == 'Y') && (UPP(7) == 'P') &&
                    (UPP(8) == 'E')) {
                    htmlParseDocTypeDecl(ctxt);
                } else if ((NXT(2) == '-') && (NXT(3) == '-')) {
                    SKIP(4);
                    htmlParseComment(ctxt, /* bogus */ 0);
                } else {
                    SKIP(2);
                    htmlParseComment(ctxt, /* bogus */ 1);
                }
            } else if (NXT(1) == '?') {
                SKIP(1);
                htmlParseComment(ctxt, /* bogus */ 1);
            } else if (IS_ASCII_LETTER(NXT(1))) {
                htmlParseElementInternal(ctxt);
            } else {
                htmlStartCharData(ctxt);
                if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
                    (ctxt->sax->characters != NULL))
                    ctxt->sax->characters(ctxt->userData, BAD_CAST "<", 1);
                SKIP(1);
            }
        } else {
            htmlParseCharData(ctxt, /* partial */ 0);
        }

        SHRINK;
        GROW;
    }

    if (ctxt->input->cur >= ctxt->input->end)
        htmlAutoCloseOnEnd(ctxt);
}